

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O2

bool llvm::sys::getHostCPUFeatures(StringMap<bool,_llvm::MallocAllocator> *Features)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  bool *pbVar7;
  uint uVar8;
  undefined1 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint in_XCR0;
  StringRef Key;
  StringRef Key_00;
  StringRef Key_01;
  StringRef Key_02;
  StringRef Key_03;
  StringRef Key_04;
  StringRef Key_05;
  StringRef Key_06;
  StringRef Key_07;
  StringRef Key_08;
  StringRef Key_09;
  StringRef Key_10;
  StringRef Key_11;
  StringRef Key_12;
  StringRef Key_13;
  StringRef Key_14;
  StringRef Key_15;
  StringRef Key_16;
  StringRef Key_17;
  StringRef Key_18;
  StringRef Key_19;
  StringRef Key_20;
  StringRef Key_21;
  StringRef Key_22;
  StringRef Key_23;
  StringRef Key_24;
  StringRef Key_25;
  StringRef Key_26;
  StringRef Key_27;
  StringRef Key_28;
  StringRef Key_29;
  StringRef Key_30;
  StringRef Key_31;
  StringRef Key_32;
  StringRef Key_33;
  StringRef Key_34;
  StringRef Key_35;
  StringRef Key_36;
  StringRef Key_37;
  StringRef Key_38;
  StringRef Key_39;
  StringRef Key_40;
  StringRef Key_41;
  StringRef Key_42;
  StringRef Key_43;
  StringRef Key_44;
  StringRef Key_45;
  StringRef Key_46;
  StringRef Key_47;
  StringRef Key_48;
  StringRef Key_49;
  StringRef Key_50;
  StringRef Key_51;
  StringRef Key_52;
  StringRef Key_53;
  StringRef Key_54;
  StringRef Key_55;
  StringRef Key_56;
  StringRef Key_57;
  StringRef Key_58;
  StringRef Key_59;
  StringRef Key_60;
  StringRef Key_61;
  StringRef Key_62;
  StringRef Key_63;
  StringRef Key_64;
  StringRef Key_65;
  StringRef Key_66;
  StringRef Key_67;
  StringRef Key_68;
  StringRef Key_69;
  StringRef Key_70;
  StringRef Key_71;
  StringRef Key_72;
  StringRef Key_73;
  StringRef Key_74;
  uint local_5c;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar3 = *puVar1;
  if (uVar3 != 0) {
    puVar1 = (uint *)cpuid_Version_info(1);
    local_44 = *puVar1;
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    Key.Length = 4;
    Key.Data = "cmov";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key);
    *pbVar7 = (bool)((byte)(uVar4 >> 0xf) & 1);
    Key_00.Length = 3;
    Key_00.Data = "mmx";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_00);
    *pbVar7 = (bool)((byte)(uVar4 >> 0x17) & 1);
    Key_01.Length = 3;
    Key_01.Data = "sse";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_01);
    bVar6 = (byte)(uVar4 >> 0x18);
    *pbVar7 = (bool)(bVar6 >> 1 & 1);
    Key_02.Length = 4;
    Key_02.Data = "sse2";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_02);
    *pbVar7 = (bool)(bVar6 >> 2 & 1);
    Key_03.Length = 4;
    Key_03.Data = "sse3";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_03);
    *pbVar7 = (bool)((byte)uVar5 & 1);
    Key_04.Length = 6;
    Key_04.Data = "pclmul";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_04);
    *pbVar7 = (bool)((byte)uVar5 >> 1 & 1);
    Key_05.Length = 5;
    Key_05.Data = "ssse3";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_05);
    *pbVar7 = (bool)((byte)(uVar5 >> 9) & 1);
    Key_06.Length = 4;
    Key_06.Data = "cx16";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_06);
    *pbVar7 = (bool)((byte)(uVar5 >> 0xd) & 1);
    Key_07.Length = 6;
    Key_07.Data = "sse4.1";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_07);
    *pbVar7 = (bool)((byte)(uVar5 >> 0x13) & 1);
    Key_08.Length = 6;
    Key_08.Data = "sse4.2";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_08);
    *pbVar7 = (bool)((byte)(uVar5 >> 0x14) & 1);
    Key_09.Length = 5;
    Key_09.Data = "movbe";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_09);
    *pbVar7 = (bool)((byte)(uVar5 >> 0x16) & 1);
    Key_10.Length = 6;
    Key_10.Data = "popcnt";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_10);
    *pbVar7 = (bool)((byte)(uVar5 >> 0x17) & 1);
    Key_11.Length = 3;
    Key_11.Data = "aes";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_11);
    bVar6 = (byte)(uVar5 >> 0x18);
    *pbVar7 = (bool)(bVar6 >> 1 & 1);
    Key_12.Length = 5;
    Key_12.Data = "rdrnd";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_12);
    *pbVar7 = (bool)(bVar6 >> 6 & 1);
    bVar12 = (~uVar5 & 0x18000000) == 0;
    if (bVar12) {
      local_44 = in_XCR0;
    }
    bVar12 = bVar12 && (~in_XCR0 & 6) == 0;
    uVar8 = ~local_44;
    Key_13.Length = 3;
    Key_13.Data = "avx";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_13);
    *pbVar7 = bVar12;
    Key_14.Length = 3;
    Key_14.Data = "fma";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_14);
    *pbVar7 = (bool)((byte)(uVar5 >> 0xc) & 1 & bVar12);
    Key_15.Length = 5;
    Key_15.Data = "xsave";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_15);
    *pbVar7 = (bool)(bVar6 >> 2 & 1 & bVar12);
    Key_16.Length = 4;
    Key_16.Data = "f16c";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_16);
    *pbVar7 = (bool)(bVar6 >> 5 & 1 & bVar12);
    puVar1 = (uint *)cpuid(0x80000000);
    uVar4 = *puVar1;
    local_4c = puVar1[1];
    local_48 = puVar1[2];
    local_5c = puVar1[3];
    if (0x80000000 < uVar4) {
      puVar1 = (uint *)cpuid(0x80000001);
      local_44 = *puVar1;
      local_4c = puVar1[1];
      local_48 = puVar1[2];
      local_5c = puVar1[3];
    }
    bVar10 = 0x80000000 < uVar4;
    Key_17.Length = 4;
    Key_17.Data = "sahf";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_17);
    *pbVar7 = (bool)((byte)local_5c & bVar10);
    Key_18.Length = 5;
    Key_18.Data = "lzcnt";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_18);
    *pbVar7 = (bool)((byte)((local_5c & 0x20) >> 5) & bVar10);
    Key_19.Length = 5;
    Key_19.Data = "sse4a";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_19);
    *pbVar7 = (bool)((byte)((local_5c & 0x40) >> 6) & bVar10);
    Key_20.Length = 6;
    Key_20.Data = "prfchw";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_20);
    *pbVar7 = (bool)((byte)(local_5c >> 8) & 1 & bVar10);
    Key_21.Length = 3;
    Key_21.Data = "xop";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_21);
    *pbVar7 = bVar10 && ((local_5c >> 0xb & 1) != 0 && bVar12);
    Key_22.Length = 3;
    Key_22.Data = "lwp";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_22);
    *pbVar7 = (short)local_5c < 0 && bVar10;
    Key_23.Length = 4;
    Key_23.Data = "fma4";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_23);
    *pbVar7 = 0x80000000 < uVar4 && ((local_5c >> 0x10 & 1) != 0 && bVar12);
    Key_24.Length = 3;
    Key_24.Data = "tbm";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_24);
    *pbVar7 = (bool)((byte)(local_5c >> 0x15) & 1 & bVar10);
    Key_25.Length = 6;
    Key_25.Data = "mwaitx";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_25);
    *pbVar7 = (bool)((byte)(local_5c >> 0x1d) & 1 & bVar10);
    if (0x80000007 < uVar4) {
      puVar1 = (uint *)cpuid(0x80000008);
      local_44 = *puVar1;
      local_4c = puVar1[1];
      local_48 = puVar1[2];
      local_5c = puVar1[3];
    }
    bVar10 = bVar12 && (uVar8 & 0xe0) == 0;
    Key_26.Length = 6;
    Key_26.Data = "clzero";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_26);
    *pbVar7 = (bool)((byte)local_4c & 0x80000007 < uVar4);
    Key_27.Length = 8;
    Key_27.Data = "wbnoinvd";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_27);
    *pbVar7 = (bool)((byte)(local_4c >> 9) & 1 & 0x80000007 < uVar4);
    if (6 < uVar3) {
      puVar1 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
      local_44 = *puVar1;
      local_4c = puVar1[1];
      local_48 = puVar1[2];
      local_5c = puVar1[3];
    }
    uVar9 = (char)(local_4c & 0x20);
    if ((local_4c & 0x20) != 0) {
      uVar9 = bVar12;
    }
    bVar11 = 6 < uVar3;
    if (!bVar11) {
      uVar9 = false;
    }
    Key_28.Length = 8;
    Key_28.Data = "fsgsbase";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_28);
    *pbVar7 = (local_4c & 1) != 0 && bVar11;
    Key_29.Length = 3;
    Key_29.Data = "sgx";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_29);
    *pbVar7 = (bool)((byte)((local_4c & 4) >> 2) & bVar11);
    Key_30.Length = 3;
    Key_30.Data = "bmi";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_30);
    *pbVar7 = (bool)((byte)((local_4c & 8) >> 3) & bVar11);
    Key_31.Length = 4;
    Key_31.Data = "avx2";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_31);
    *pbVar7 = (bool)uVar9;
    Key_32.Length = 4;
    Key_32.Data = "bmi2";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_32);
    *pbVar7 = (bool)((byte)(local_4c >> 8) & 1 & bVar11);
    Key_33.Length = 7;
    Key_33.Data = "invpcid";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_33);
    *pbVar7 = (bool)((byte)(local_4c >> 10) & 1 & bVar11);
    Key_34.Length = 3;
    Key_34.Data = "rtm";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_34);
    *pbVar7 = (bool)((byte)(local_4c >> 0xb) & 1 & bVar11);
    if (uVar3 < 7) {
      Key_36.Length = 7;
      Key_36.Data = "avx512f";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_36);
      *pbVar7 = false;
    }
    else {
      Key_35.Length = 7;
      Key_35.Data = "avx512f";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_35);
      *pbVar7 = (local_4c >> 0x10 & 1) != 0 && bVar10;
    }
    bVar11 = 6 < uVar3;
    Key_37.Length = 8;
    Key_37.Data = "avx512dq";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_37);
    *pbVar7 = uVar3 >= 7 && ((local_4c >> 0x11 & 1) != 0 && bVar10);
    Key_38.Length = 6;
    Key_38.Data = "rdseed";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_38);
    *pbVar7 = (bool)((byte)(local_4c >> 0x12) & 1 & bVar11);
    Key_39.Length = 3;
    Key_39.Data = "adx";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_39);
    *pbVar7 = (bool)((byte)(local_4c >> 0x13) & 1 & bVar11);
    Key_40.Length = 10;
    Key_40.Data = "avx512ifma";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_40);
    *pbVar7 = (bool)((byte)(local_4c >> 0x15) & 1 & bVar11 & bVar10);
    Key_41.Length = 10;
    Key_41.Data = "clflushopt";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_41);
    *pbVar7 = (bool)((byte)(local_4c >> 0x17) & 1 & bVar11);
    bVar6 = (byte)(local_4c >> 0x18);
    Key_42.Length = 4;
    Key_42.Data = "clwb";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_42);
    *pbVar7 = (bool)(bVar6 & 1 & bVar11);
    if (uVar3 < 7) {
      Key_44.Length = 8;
      Key_44.Data = "avx512pf";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_44);
      *pbVar7 = false;
    }
    else {
      Key_43.Length = 8;
      Key_43.Data = "avx512pf";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_43);
      *pbVar7 = (local_4c >> 0x1a & 1) != 0 && bVar10;
    }
    Key_45.Length = 8;
    Key_45.Data = "avx512er";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_45);
    *pbVar7 = uVar3 >= 7 && ((local_4c >> 0x1b & 1) != 0 && bVar10);
    Key_46.Length = 8;
    Key_46.Data = "avx512cd";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_46);
    *pbVar7 = (bool)(bVar6 >> 4 & 1 & 6 < uVar3 & bVar10);
    Key_47.Length = 3;
    Key_47.Data = "sha";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_47);
    *pbVar7 = (bool)(bVar6 >> 5 & 1 & 6 < uVar3);
    if (uVar3 < 7) {
      Key_49.Length = 8;
      Key_49.Data = "avx512bw";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_49);
      *pbVar7 = false;
    }
    else {
      Key_48.Length = 8;
      Key_48.Data = "avx512bw";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_48);
      *pbVar7 = (local_4c >> 0x1e & 1) != 0 && bVar10;
    }
    bVar11 = 6 < uVar3;
    Key_50.Length = 8;
    Key_50.Data = "avx512vl";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_50);
    *pbVar7 = uVar3 >= 7 && ((int)local_4c < 0 && bVar10);
    Key_51.Length = 0xb;
    Key_51.Data = "prefetchwt1";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_51);
    *pbVar7 = (bool)(bVar11 & (byte)local_5c);
    Key_52.Length = 10;
    Key_52.Data = "avx512vbmi";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_52);
    *pbVar7 = (bool)((byte)((local_5c & 2) >> 1) & bVar11 & bVar10);
    Key_53.Length = 3;
    Key_53.Data = "pku";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_53);
    *pbVar7 = (bool)((byte)((local_5c & 0x10) >> 4) & bVar11);
    Key_54.Length = 7;
    Key_54.Data = "waitpkg";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_54);
    *pbVar7 = (bool)((byte)((local_5c & 0x20) >> 5) & bVar11);
    Key_55.Length = 0xb;
    Key_55.Data = "avx512vbmi2";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_55);
    *pbVar7 = (bool)((byte)((local_5c & 0x40) >> 6) & bVar11 & bVar10);
    Key_56.Length = 5;
    Key_56.Data = "shstk";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_56);
    *pbVar7 = (char)(byte)local_5c < '\0' && bVar11;
    Key_57.Length = 4;
    Key_57.Data = "gfni";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_57);
    *pbVar7 = (bool)((byte)(local_5c >> 8) & 1 & bVar11);
    if (uVar3 < 7) {
      Key_59.Length = 4;
      Key_59.Data = "vaes";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_59);
      *pbVar7 = false;
    }
    else {
      Key_58.Length = 4;
      Key_58.Data = "vaes";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_58);
      *pbVar7 = (local_5c >> 9 & 1) != 0 && bVar12;
    }
    Key_60.Length = 10;
    Key_60.Data = "vpclmulqdq";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_60);
    *pbVar7 = uVar3 >= 7 && ((local_5c >> 10 & 1) != 0 && bVar12);
    if (uVar3 < 7) {
      Key_62.Length = 10;
      Key_62.Data = "avx512vnni";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_62);
      *pbVar7 = false;
    }
    else {
      Key_61.Length = 10;
      Key_61.Data = "avx512vnni";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_61);
      *pbVar7 = (local_5c >> 0xb & 1) != 0 && bVar10;
    }
    bVar11 = 6 < uVar3;
    Key_63.Length = 0xc;
    Key_63.Data = "avx512bitalg";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_63);
    *pbVar7 = uVar3 >= 7 && ((local_5c >> 0xc & 1) != 0 && bVar10);
    Key_64.Length = 0xf;
    Key_64.Data = "avx512vpopcntdq";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_64);
    *pbVar7 = (bool)((byte)(local_5c >> 0xe) & 1 & bVar11 & bVar10);
    Key_65.Length = 5;
    Key_65.Data = "rdpid";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_65);
    *pbVar7 = (bool)((byte)(local_5c >> 0x16) & 1 & bVar11);
    bVar6 = (byte)(local_5c >> 0x18);
    Key_66.Length = 8;
    Key_66.Data = "cldemote";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_66);
    *pbVar7 = (bool)(bVar6 >> 1 & 1 & bVar11);
    Key_67.Length = 7;
    Key_67.Data = "movdiri";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_67);
    *pbVar7 = (bool)(bVar6 >> 3 & 1 & bVar11);
    Key_68.Length = 9;
    Key_68.Data = "movdir64b";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_68);
    *pbVar7 = (bool)(bVar6 >> 4 & 1 & bVar11);
    Key_69.Length = 7;
    Key_69.Data = "pconfig";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_69);
    *pbVar7 = (bool)((byte)(local_48 >> 0x12) & 1 & bVar11);
    if (uVar3 < 0xd) {
      Key_71.Length = 8;
      Key_71.Data = "xsaveopt";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_71);
      *pbVar7 = false;
      uVar9 = false;
    }
    else {
      puVar1 = (uint *)cpuid_Processor_Extended_States_info(0xd);
      local_44 = *puVar1;
      local_4c = puVar1[1];
      bVar10 = SUB41(local_44 & 1,0);
      if ((local_44 & 1) != 0) {
        bVar10 = bVar12;
      }
      Key_70.Length = 8;
      Key_70.Data = "xsaveopt";
      pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_70);
      *pbVar7 = bVar10;
      uVar9 = (char)(local_44 & 2);
      if ((local_44 & 2) != 0) {
        uVar9 = bVar12;
      }
    }
    Key_72.Length = 6;
    Key_72.Data = "xsavec";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_72);
    *pbVar7 = (bool)uVar9;
    Key_73.Length = 6;
    Key_73.Data = "xsaves";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_73);
    *pbVar7 = 0xc < uVar3 && ((local_44 & 8) != 0 && bVar12);
    if (0x13 < uVar3) {
      lVar2 = cpuid(0x14);
      local_4c = *(uint *)(lVar2 + 4);
    }
    Key_74.Length = 7;
    Key_74.Data = "ptwrite";
    pbVar7 = StringMap<bool,_llvm::MallocAllocator>::operator[](Features,Key_74);
    *pbVar7 = (bool)((byte)((local_4c & 0x10) >> 4) & 0x13 < uVar3);
  }
  return uVar3 != 0;
}

Assistant:

static bool getX86CpuIDAndInfo(unsigned value, unsigned *rEAX, unsigned *rEBX,
                               unsigned *rECX, unsigned *rEDX) {
#if defined(__GNUC__) || defined(__clang__)
#if defined(__x86_64__)
  // gcc doesn't know cpuid would clobber ebx/rbx. Preserve it manually.
  // FIXME: should we save this for Clang?
  __asm__("movq\t%%rbx, %%rsi\n\t"
          "cpuid\n\t"
          "xchgq\t%%rbx, %%rsi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#elif defined(__i386__)
  __asm__("movl\t%%ebx, %%esi\n\t"
          "cpuid\n\t"
          "xchgl\t%%ebx, %%esi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#else
  return true;
#endif
#elif defined(_MSC_VER)
  // The MSVC intrinsic is portable across x86 and x64.
  int registers[4];
  __cpuid(registers, value);
  *rEAX = registers[0];
  *rEBX = registers[1];
  *rECX = registers[2];
  *rEDX = registers[3];
  return false;
#else
  return true;
#endif
}